

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O2

FT_Error tt_hvadvance_adjust(TT_Face face,FT_UInt gindex,FT_Int *avalue,FT_Bool vertical)

{
  uint uVar1;
  GX_HVVarTable itemStore;
  FT_UInt *pFVar2;
  FT_Error FVar3;
  FT_Int FVar4;
  FT_UInt outerIndex;
  GX_Blend pGVar5;
  GX_HVVarTable *ppGVar6;
  ulong uVar7;
  
  if ((face->doblend != '\0') && (pGVar5 = face->blend, pGVar5 != (GX_Blend)0x0)) {
    if (vertical == '\0') {
      if (pGVar5->hvar_loaded == '\0') {
        FVar3 = ft_var_load_hvvar(face,'\0');
        pGVar5 = face->blend;
        pGVar5->hvar_error = FVar3;
      }
      if (pGVar5->hvar_checked == '\0') {
        return pGVar5->hvar_error;
      }
      ppGVar6 = &pGVar5->hvar_table;
    }
    else {
      if (pGVar5->vvar_loaded == '\0') {
        FVar3 = ft_var_load_hvvar(face,'\x01');
        pGVar5 = face->blend;
        pGVar5->vvar_error = FVar3;
      }
      if (pGVar5->vvar_checked == '\0') {
        return pGVar5->vvar_error;
      }
      ppGVar6 = &pGVar5->vvar_table;
    }
    itemStore = *ppGVar6;
    pFVar2 = (itemStore->widthMap).innerIndex;
    if (pFVar2 == (FT_UInt *)0x0) {
      outerIndex = 0;
      if (((itemStore->itemStore).varData)->itemCount <= gindex) {
        return 6;
      }
    }
    else {
      uVar1 = (itemStore->widthMap).mapCount;
      uVar7 = (ulong)(uVar1 - 1);
      if (gindex < uVar1) {
        uVar7 = (ulong)gindex;
      }
      outerIndex = (itemStore->widthMap).outerIndex[uVar7];
      gindex = pFVar2[uVar7];
    }
    FVar4 = ft_var_get_item_delta(face,&itemStore->itemStore,outerIndex,gindex);
    *avalue = *avalue + FVar4;
  }
  return 0;
}

Assistant:

static FT_Error
  tt_hvadvance_adjust( TT_Face  face,
                       FT_UInt  gindex,
                       FT_Int  *avalue,
                       FT_Bool  vertical )
  {
    FT_Error  error = FT_Err_Ok;
    FT_UInt   innerIndex, outerIndex;
    FT_Int    delta;

    GX_HVVarTable  table;


    if ( !face->doblend || !face->blend )
      goto Exit;

    if ( vertical )
    {
      if ( !face->blend->vvar_loaded )
      {
        /* initialize vvar table */
        face->blend->vvar_error = ft_var_load_hvvar( face, 1 );
      }

      if ( !face->blend->vvar_checked )
      {
        error = face->blend->vvar_error;
        goto Exit;
      }

      table = face->blend->vvar_table;
    }
    else
    {
      if ( !face->blend->hvar_loaded )
      {
        /* initialize hvar table */
        face->blend->hvar_error = ft_var_load_hvvar( face, 0 );
      }

      if ( !face->blend->hvar_checked )
      {
        error = face->blend->hvar_error;
        goto Exit;
      }

      table = face->blend->hvar_table;
    }

    /* advance width or height adjustments are always present in an */
    /* `HVAR' or `VVAR' table; no need to test for this capability  */

    if ( table->widthMap.innerIndex )
    {
      FT_UInt  idx = gindex;


      if ( idx >= table->widthMap.mapCount )
        idx = table->widthMap.mapCount - 1;

      /* trust that HVAR parser has checked indices */
      outerIndex = table->widthMap.outerIndex[idx];
      innerIndex = table->widthMap.innerIndex[idx];
    }
    else
    {
      GX_ItemVarData  varData;


      /* no widthMap data */
      outerIndex = 0;
      innerIndex = gindex;

      varData = &table->itemStore.varData[outerIndex];
      if ( gindex >= varData->itemCount )
      {
        FT_TRACE2(( "gindex %d out of range\n", gindex ));
        error = FT_THROW( Invalid_Argument );
        goto Exit;
      }
    }

    delta = ft_var_get_item_delta( face,
                                   &table->itemStore,
                                   outerIndex,
                                   innerIndex );

    FT_TRACE5(( "%s value %d adjusted by %d unit%s (%s)\n",
                vertical ? "vertical height" : "horizontal width",
                *avalue,
                delta,
                delta == 1 ? "" : "s",
                vertical ? "VVAR" : "HVAR" ));

    *avalue += delta;

  Exit:
    return error;
  }